

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_client.c
# Opt level: O0

int proxy_client_connect(proxy_client_handle *ch)

{
  conn_handle *conn;
  uint8_t *buff;
  uint32_t nonce_00;
  size_t buff_len;
  int local_4c;
  uint8_t local_48 [4];
  int ret;
  uint8_t response [16];
  char nonce_str [8];
  uint32_t nonce;
  char *password;
  proxy_client_priv *priv;
  proxy_client_handle *ch_local;
  
  conn = (conn_handle *)ch->priv;
  unique0x00012000 = ch->password;
  if (unique0x00012000 == (char *)0x0) {
    stack0xffffffffffffffd8 = "PUBLIC";
  }
  local_4c = conn_connect(conn,ch->host_addr,ch->host_port);
  if ((-1 < local_4c) && (local_4c = conn_recv(conn,response + 0xc,8), -1 < local_4c)) {
    nonce_00 = hex32_to_digest((char *)(response + 0xc));
    local_4c = get_password_response(nonce_00,stack0xffffffffffffffd8,local_48);
    if (-1 < local_4c) {
      if (ch->callsign != (char *)0x0) {
        buff = (uint8_t *)ch->callsign;
        buff_len = strlen(ch->callsign);
        local_4c = conn_send(conn,buff,buff_len);
        if (local_4c < 0) goto LAB_00107a15;
      }
      local_4c = conn_send(conn,"\n",1);
      if ((-1 < local_4c) && (local_4c = conn_send(conn,local_48,0x10), -1 < local_4c)) {
        return 0;
      }
    }
  }
LAB_00107a15:
  conn_close(conn);
  return local_4c;
}

Assistant:

int proxy_client_connect(struct proxy_client_handle *ch)
{
	struct proxy_client_priv *priv = ch->priv;
	const char *password = ch->password;
	uint32_t nonce;
	char nonce_str[8];
	uint8_t response[PROXY_PASS_RES_LEN];
	int ret;

	if (password == NULL)
		password = "PUBLIC";

	ret = conn_connect(&priv->conn, ch->host_addr, ch->host_port);
	if (ret < 0)
		goto proxy_client_connection_exit;

	/* Receive the nonce */
	ret = conn_recv(&priv->conn, (uint8_t *)nonce_str,
			sizeof(nonce_str));
	if (ret < 0)
		goto proxy_client_connection_exit;

	nonce = hex32_to_digest(nonce_str);

	/* Compute the password response */
	ret = get_password_response(nonce, password, response);
	if (ret < 0)
		goto proxy_client_connection_exit;

	/* Send the callsign, a newline, and the response */
	if (ch->callsign != NULL) {
		ret = conn_send(&priv->conn, (uint8_t *)ch->callsign,
				strlen(ch->callsign));
		if (ret < 0)
			goto proxy_client_connection_exit;
	}

	ret = conn_send(&priv->conn, (uint8_t *)"\n", 1);
	if (ret < 0)
		goto proxy_client_connection_exit;

	ret = conn_send(&priv->conn, response, PROXY_PASS_RES_LEN);
	if (ret < 0)
		goto proxy_client_connection_exit;

	/* No news is good news, so we won't know how things went
	 * until we actually try to process the returning messages
	 */

	return 0;

proxy_client_connection_exit:
	conn_close(&priv->conn);

	return ret;
}